

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

bool dgrminer::is_min_code
               (vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *edge_list,
               vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *starting_edges)

{
  int *piVar1;
  mapped_type mVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  array<int,_10UL> *paVar6;
  pointer paVar7;
  pointer piVar8;
  pointer paVar9;
  int iVar10;
  pointer plVar11;
  bool bVar12;
  int iVar13;
  ulong uVar14;
  size_type __n;
  size_type sVar15;
  mapped_type *pmVar16;
  reference piVar17;
  _Elt_pointer piVar18;
  ulong uVar19;
  long lVar20;
  pointer piVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  array<int,_10UL> *pattern_edge2;
  int i;
  int j;
  bool bVar26;
  reference rVar27;
  vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
  edge_candidates;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> built_min_code;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  all_edge_candidates_selected_edges_ind;
  deque<int,_std::allocator<int>_> right_most_path;
  vector<bool,_std::allocator<bool>_> selected_edges;
  vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
  all_edge_candidates;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  amount_of_usage_of_original_vertices;
  vector<int,_std::allocator<int>_> dst_vertices;
  vector<int,_std::allocator<int>_> src_vertices;
  vector<int,_std::allocator<int>_> selected_edges_ind;
  array<int,_10UL> built_min_code_edge;
  value_type local_144;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> vertex_id_mapping;
  vector<int,_std::allocator<int>_> selected_candidates;
  deque<int,_std::allocator<int>_> right_most_path_occurrence;
  vector<int,_std::allocator<int>_> indices_of_min_edges;
  
  uVar14 = ((long)(edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  lVar20 = 0;
  iVar13 = (int)uVar14;
  uVar19 = 0;
  if (0 < iVar13) {
    uVar19 = uVar14 & 0xffffffff;
  }
  for (; uVar19 * 0x28 - lVar20 != 0; lVar20 = lVar20 + 0x28) {
    flipPatternEdge((array<int,_10UL> *)
                    ((long)((edge_list->
                            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar20));
    std::vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>>::
    emplace_back<std::array<int,10ul>>
              ((vector<std::array<int,10ul>,std::allocator<std::array<int,10ul>>> *)edge_list,
               (array<int,_10UL> *)&right_most_path);
  }
  uVar19 = (ulong)((long)(starting_edges->
                         super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(starting_edges->
                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                        )._M_impl.super__Vector_impl_data._M_start) >> 5;
  uVar22 = 0;
  uVar14 = uVar19 & 0xffffffff;
  if ((int)uVar19 < 1) {
    uVar14 = uVar22;
  }
  for (; uVar14 * 0x20 != uVar22; uVar22 = uVar22 + 0x20) {
    flipAdjacencyInfo((array<int,_8UL> *)
                      ((long)((starting_edges->
                              super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->_M_elems + uVar22));
    std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>::
    emplace_back<std::array<int,8ul>>
              ((vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>> *)starting_edges,
               (array<int,_8UL> *)&right_most_path);
  }
  find_minimum_labelings(&indices_of_min_edges,edge_list,starting_edges,false);
  iVar10 = iVar13 * 2;
  __n = (size_type)iVar13;
  piVar21 = indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    bVar26 = piVar21 ==
             indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (bVar26) {
      bVar26 = true;
      goto LAB_0011b102;
    }
    iVar25 = *piVar21;
    built_min_code_edge._M_elems[0] = 0;
    built_min_code_edge._M_elems[1] = 1;
    sVar15 = (size_type)iVar25;
    paVar6 = (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    built_min_code_edge._M_elems[2] = paVar6[sVar15]._M_elems[2];
    built_min_code_edge._M_elems[3] = paVar6[sVar15]._M_elems[3];
    built_min_code_edge._M_elems[4] = paVar6[sVar15]._M_elems[4];
    built_min_code_edge._M_elems[5] = paVar6[sVar15]._M_elems[5];
    built_min_code_edge._M_elems[6] = paVar6[sVar15]._M_elems[6];
    built_min_code_edge._M_elems[7] = paVar6[sVar15]._M_elems[7];
    built_min_code_edge._M_elems[8] = paVar6[sVar15]._M_elems[8];
    built_min_code_edge._M_elems[9] = paVar6[sVar15]._M_elems[9];
    bVar12 = is_pattern_edge_smaller_than(&built_min_code_edge,paVar6,true);
    if (bVar12) break;
    built_min_code.
    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    built_min_code.
    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    built_min_code.
    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
              (&built_min_code,&built_min_code_edge);
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)
             ((ulong)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_map & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              (&selected_edges,(long)iVar10,(bool *)&right_most_path,
               (allocator_type *)&right_most_path_occurrence);
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)
             CONCAT44(right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_map._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::vector
              (&selected_edges_ind,__n,(value_type_conflict1 *)&right_most_path,
               (allocator_type *)&right_most_path_occurrence);
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)
             ((ulong)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_map & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&selected_candidates,__n,(value_type_conflict1 *)&right_most_path,
               (allocator_type *)&right_most_path_occurrence);
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)0x0;
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map_size = 0;
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_start._M_cur = (_Elt_pointer)0x0;
    std::
    vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
    ::vector(&all_edge_candidates,__n,(value_type *)&right_most_path,
             (allocator_type *)&right_most_path_occurrence);
    std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
              ((_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *)
               &right_most_path);
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)0x0;
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map_size = 0;
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_start._M_cur = (_Elt_pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&all_edge_candidates_selected_edges_ind,__n,(value_type *)&right_most_path,
             (allocator_type *)&right_most_path_occurrence);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&right_most_path);
    *selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = iVar25;
    rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,sVar15);
    *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
    rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (&selected_edges,(long)((iVar25 + iVar13) % iVar10));
    *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
    src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _S_red;
    amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header;
    amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header;
    vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    mVar2 = (edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start[sVar15]._M_elems[0];
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)
             ((ulong)right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_map & 0xffffffff00000000);
    amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         amount_of_usage_of_original_vertices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         vertex_id_mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](&vertex_id_mapping,(key_type *)&right_most_path);
    *pmVar16 = mVar2;
    mVar2 = (edge_list->
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
            _M_impl.super__Vector_impl_data._M_start[sVar15]._M_elems[1];
    right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
    _M_map = (_Map_pointer)
             CONCAT44(right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                      super__Deque_impl_data._M_map._4_4_,1);
    pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](&vertex_id_mapping,(key_type *)&right_most_path);
    *pmVar16 = mVar2;
    lVar20 = 0;
    for (uVar14 = 0;
        paVar7 = (edge_list->
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar14 < (ulong)(((long)(edge_list->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)paVar7) / 0x28);
        uVar14 = uVar14 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&src_vertices,(value_type_conflict1 *)((long)paVar7->_M_elems + lVar20));
      std::vector<int,_std::allocator<int>_>::push_back
                (&dst_vertices,
                 (value_type_conflict1 *)
                 ((long)((edge_list->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar20 + 4));
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&amount_of_usage_of_original_vertices,
                           (key_type *)
                           ((long)((edge_list->
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar20));
      *pmVar16 = 0;
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&amount_of_usage_of_original_vertices,
                           (key_type *)
                           ((long)((edge_list->
                                   super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                           lVar20 + 4));
      *pmVar16 = 0;
      lVar20 = lVar20 + 0x28;
    }
    pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](&amount_of_usage_of_original_vertices,paVar7[sVar15]._M_elems);
    *pmVar16 = 1;
    pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[](&amount_of_usage_of_original_vertices,
                         (edge_list->
                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[sVar15]._M_elems + 1);
    *pmVar16 = 1;
    iVar25 = 1;
LAB_0011a8d1:
    iVar25 = iVar25 - (uint)(iVar13 <= iVar25);
    if (iVar25 != 0) {
      iVar3 = selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar25];
      if (iVar3 == 0) {
        find_rightmost_path(&right_most_path,&built_min_code);
        std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
                  (&right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>);
        for (uVar14 = 0; sVar15 = std::deque<int,_std::allocator<int>_>::size(&right_most_path),
            uVar14 < sVar15; uVar14 = uVar14 + 1) {
          piVar17 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                              (&right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl
                                .super__Deque_impl_data._M_start,uVar14);
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,piVar17);
          std::deque<int,_std::allocator<int>_>::push_back(&right_most_path_occurrence,pmVar16);
        }
        piVar18 = right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        if (right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first) {
          piVar18 = right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        iVar3 = piVar18[-1];
        edge_candidates.
        super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        edge_candidates.
        super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        edge_candidates.
        super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar14 = 0; sVar15 = std::deque<int,_std::allocator<int>_>::size(&right_most_path),
            uVar14 < sVar15 - 1; uVar14 = uVar14 + 1) {
          piVar17 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                              (&right_most_path_occurrence.
                                super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                super__Deque_impl_data._M_start,uVar14);
          iVar4 = *piVar17;
          lVar20 = 6;
          for (uVar19 = 0;
              uVar19 < (ulong)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
              uVar19 = uVar19 + 1) {
            rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,uVar19);
            if ((((*rVar27._M_p & rVar27._M_mask) == 0) &&
                (src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar19] == iVar3)) &&
               (dst_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19] == iVar4)) {
              piVar18 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
                piVar18 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
              }
              iVar5 = piVar18[-1];
              piVar17 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                  (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start,uVar14);
              local_144.elements._M_elems[1] = *piVar17;
              paVar7 = (edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              piVar1 = paVar7->_M_elems + lVar20 + -4;
              local_144.elements._M_elems._8_8_ = *(undefined8 *)piVar1;
              local_144.elements._M_elems._16_8_ = *(undefined8 *)(piVar1 + 2);
              piVar1 = paVar7->_M_elems + lVar20;
              local_144.elements._M_elems._24_8_ = *(undefined8 *)piVar1;
              local_144.elements._M_elems._32_8_ = *(undefined8 *)(piVar1 + 2);
              local_144.index = (int)uVar19;
              local_144.elements._M_elems[0] = iVar5;
              std::
              vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
              ::push_back(&edge_candidates,&local_144);
            }
            lVar20 = lVar20 + 10;
          }
        }
        sVar15 = std::deque<int,_std::allocator<int>_>::size(&right_most_path);
        uVar14 = sVar15 & 0xffffffff;
        while( true ) {
          uVar14 = uVar14 - 1;
          if ((int)(uint)uVar14 < 0) break;
          uVar19 = (ulong)((uint)uVar14 & 0x7fffffff);
          piVar17 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                              (&right_most_path_occurrence.
                                super__Deque_base<int,_std::allocator<int>_>._M_impl.
                                super__Deque_impl_data._M_start,uVar19);
          iVar3 = *piVar17;
          lVar20 = 6;
          lVar23 = 0;
          for (uVar22 = 0;
              uVar22 < (ulong)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset
                       + ((long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                         (long)selected_edges.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
              uVar22 = uVar22 + 1) {
            rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,uVar22);
            if ((((*rVar27._M_p & rVar27._M_mask) == 0) &&
                (src_vertices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar22] == iVar3)) &&
               (pmVar16 = std::
                          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          ::operator[](&amount_of_usage_of_original_vertices,
                                       (key_type *)
                                       ((long)dst_vertices.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + lVar23)),
               *pmVar16 == 0)) {
              piVar17 = std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                                  (&right_most_path.super__Deque_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Deque_impl_data._M_start,uVar19);
              piVar18 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_cur;
              if (right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur ==
                  right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
                piVar18 = right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
              }
              local_144.elements._M_elems[0] = *piVar17;
              local_144.elements._M_elems[1] = piVar18[-1] + 1;
              paVar7 = (edge_list->
                       super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              piVar1 = paVar7->_M_elems + lVar20 + -4;
              local_144.elements._M_elems._8_8_ = *(undefined8 *)piVar1;
              local_144.elements._M_elems._16_8_ = *(undefined8 *)(piVar1 + 2);
              piVar1 = paVar7->_M_elems + lVar20;
              local_144.elements._M_elems._24_8_ = *(undefined8 *)piVar1;
              local_144.elements._M_elems._32_8_ = *(undefined8 *)(piVar1 + 2);
              local_144.index = (int)uVar22;
              std::
              vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
              ::push_back(&edge_candidates,&local_144);
            }
            lVar23 = lVar23 + 4;
            lVar20 = lVar20 + 10;
          }
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<dgrminer::labeled_pattern_edge*,std::vector<dgrminer::labeled_pattern_edge,std::allocator<dgrminer::labeled_pattern_edge>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(dgrminer::labeled_pattern_edge_const&,dgrminer::labeled_pattern_edge_const&)>>
                  ((__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                    )edge_candidates.
                     super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<dgrminer::labeled_pattern_edge_*,_std::vector<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>_>
                    )edge_candidates.
                     super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                   (_Iter_comp_iter<bool_(*)(const_dgrminer::labeled_pattern_edge_&,_const_dgrminer::labeled_pattern_edge_&)>
                    )0x11a448);
        paVar7 = all_edge_candidates.
                 super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar25].
                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar20 = 0x28;
        if (all_edge_candidates.
            super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].
            super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish != paVar7) {
          all_edge_candidates.
          super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar25].
          super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl
          .super__Vector_impl_data._M_finish = paVar7;
        }
        piVar8 = all_edge_candidates_selected_edges_ind.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar25].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (all_edge_candidates_selected_edges_ind.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[iVar25].
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            != piVar8) {
          all_edge_candidates_selected_edges_ind.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar25].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               piVar8;
        }
        uVar14 = 0;
        while ((plVar11 = edge_candidates.
                          super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               uVar14 < (ulong)(((long)edge_candidates.
                                       super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)edge_candidates.
                                      super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x2c) &&
               ((uVar14 == 0 ||
                (bVar12 = is_pattern_edge_smaller_than
                                    ((array<int,_10UL> *)
                                     ((long)((edge_candidates.
                                              super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->elements).
                                            _M_elems + lVar20 + -0x54),
                                     (array<int,_10UL> *)
                                     ((long)(&(edge_candidates.
                                               super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->elements
                                            + -1) + lVar20),true), !bVar12))))) {
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                    (all_edge_candidates.
                     super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar25,
                     (value_type *)((long)(&plVar11->elements + -1) + lVar20));
          std::vector<int,_std::allocator<int>_>::push_back
                    (all_edge_candidates_selected_edges_ind.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + iVar25,
                     (value_type_conflict1 *)
                     ((long)((edge_candidates.
                              super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                              ._M_impl.super__Vector_impl_data._M_start)->elements)._M_elems +
                     lVar20));
          uVar14 = uVar14 + 1;
          lVar20 = lVar20 + 0x2c;
        }
        std::
        _Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
        ::~_Vector_base(&edge_candidates.
                         super__Vector_base<dgrminer::labeled_pattern_edge,_std::allocator<dgrminer::labeled_pattern_edge>_>
                       );
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  (&right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>);
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  (&right_most_path.super__Deque_base<int,_std::allocator<int>_>);
        iVar3 = selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar25];
      }
      piVar8 = selected_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      paVar7 = all_edge_candidates.
               super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar25].
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      paVar9 = all_edge_candidates.
               super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar25].
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar20 = (long)iVar3;
      lVar23 = lVar20 * 0x28;
      for (lVar24 = 0; (ulong)(lVar20 + lVar24) < (ulong)(((long)paVar9 - (long)paVar7) / 0x28);
          lVar24 = lVar24 + 1) {
        paVar6 = (array<int,_10UL> *)((long)paVar7->_M_elems + lVar23);
        pattern_edge2 =
             (edge_list->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start + iVar25;
        bVar12 = is_pattern_edge_smaller_than(paVar6,pattern_edge2,true);
        if (bVar12) goto LAB_0011b04d;
        bVar12 = is_pattern_edge_equal_to(paVar6,pattern_edge2,true);
        if (bVar12) {
          piVar8[iVar25] = iVar3 + (int)lVar24 + 1;
          std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::push_back
                    (&built_min_code,paVar6);
          mVar2 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [all_edge_candidates_selected_edges_ind.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar25].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar20 + lVar24]]._M_elems[0];
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,
                                 (key_type *)
                                 ((long)(all_edge_candidates.
                                         super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[iVar25].
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar23));
          *pmVar16 = mVar2;
          mVar2 = (edge_list->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start
                  [all_edge_candidates_selected_edges_ind.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar25].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar20 + lVar24]]._M_elems[1];
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&vertex_id_mapping,
                                 (key_type *)
                                 ((long)(all_edge_candidates.
                                         super__Vector_base<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[iVar25].
                                         super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar23 + 4));
          *pmVar16 = mVar2;
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&amount_of_usage_of_original_vertices,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [all_edge_candidates_selected_edges_ind.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar25].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar20 + lVar24]]._M_elems);
          *pmVar16 = *pmVar16 + 1;
          pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&amount_of_usage_of_original_vertices,
                                 (edge_list->
                                 super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start
                                 [all_edge_candidates_selected_edges_ind.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar25].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar20 + lVar24]]._M_elems + 1);
          *pmVar16 = *pmVar16 + 1;
          iVar3 = all_edge_candidates_selected_edges_ind.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar25].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar20 + lVar24];
          selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar25] = iVar3;
          rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,(long)iVar3)
          ;
          *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
          rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&selected_edges,(long)((iVar3 + iVar13) % iVar10));
          *rVar27._M_p = *rVar27._M_p | rVar27._M_mask;
          iVar25 = iVar25 + 1;
          goto LAB_0011a8d1;
        }
        lVar23 = lVar23 + 0x28;
      }
      piVar8[iVar25] = 0;
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&vertex_id_mapping,
                           built_min_code.
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems);
      right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_map = (_Map_pointer)
               CONCAT44(right_most_path.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                        super__Deque_impl_data._M_map._4_4_,*pmVar16);
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&vertex_id_mapping,
                           built_min_code.
                           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_elems + 1);
      right_most_path_occurrence.super__Deque_base<int,_std::allocator<int>_>._M_impl.
      super__Deque_impl_data._M_map._0_4_ = *pmVar16;
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&amount_of_usage_of_original_vertices,(key_type *)&right_most_path);
      *pmVar16 = *pmVar16 + -1;
      pmVar16 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](&amount_of_usage_of_original_vertices,
                           (key_type *)&right_most_path_occurrence);
      *pmVar16 = *pmVar16 + -1;
      built_min_code.
      super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           built_min_code.
           super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      iVar3 = selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar25];
      if ((long)iVar3 != 0xffffffffffffffff) {
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[](&selected_edges,(long)iVar3);
        *rVar27._M_p = *rVar27._M_p & ~rVar27._M_mask;
        rVar27 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (&selected_edges,(long)((iVar3 + iVar13) % iVar10));
        *rVar27._M_p = *rVar27._M_p & ~rVar27._M_mask;
        selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar25] = -1;
      }
      iVar25 = iVar25 + -1;
      goto LAB_0011a8d1;
    }
LAB_0011b04d:
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&vertex_id_mapping._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&amount_of_usage_of_original_vertices._M_t);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dst_vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&src_vertices.super__Vector_base<int,_std::allocator<int>_>);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&all_edge_candidates_selected_edges_ind);
    std::
    vector<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>,_std::allocator<std::vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>_>_>
    ::~vector(&all_edge_candidates);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&selected_candidates.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&selected_edges_ind.super__Vector_base<int,_std::allocator<int>_>);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&selected_edges.super__Bvector_base<std::allocator<bool>_>);
    std::_Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>::~_Vector_base
              (&built_min_code.
                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>);
    piVar21 = piVar21 + 1;
    if (iVar25 != 0) {
LAB_0011b102:
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&indices_of_min_edges.super__Vector_base<int,_std::allocator<int>_>);
      return bVar26;
    }
  }
  bVar26 = false;
  goto LAB_0011b102;
}

Assistant:

bool is_min_code(std::vector<std::array<int, 10>> edge_list, std::vector<std::array<int, 8>> starting_edges)
    {

        int n_edges = edge_list.size();
        for (int i = 0; i < n_edges; i++)
        {
            edge_list.push_back(flipPatternEdge(edge_list[i]));
        }

        int n_starting_edge = starting_edges.size();
        for (int i = 0; i < n_starting_edge; i++)
        {
            starting_edges.push_back(flipAdjacencyInfo(starting_edges[i]));
        }

        std::vector<int> indices_of_min_edges = find_minimum_labelings(edge_list, starting_edges, false);


        for (int min_edge_ind : indices_of_min_edges)
        {

            std::array<int, 10> built_min_code_edge = {0, 1, edge_list[min_edge_ind][2], edge_list[min_edge_ind][3],
                                                       edge_list[min_edge_ind][4],
                                                       edge_list[min_edge_ind][5], edge_list[min_edge_ind][6],
                                                       edge_list[min_edge_ind][7], edge_list[min_edge_ind][8],
                                                       edge_list[min_edge_ind][9]};

            if (is_pattern_edge_smaller_than(built_min_code_edge, edge_list[0], true))
            {
                return false;
            }

            std::vector<std::array<int, 10>> built_min_code;
            built_min_code.push_back(built_min_code_edge);


            std::vector<bool> selected_edges(2 * n_edges, false);
            std::vector<int> selected_edges_ind(n_edges, -1);

            std::vector<int> selected_candidates(n_edges,
                                                 0);  // which candidate was chosen for each edge (used for backtracking)
            // which candidates are possible for each edge (used for backtracking), we are not interested in the 1st element
            std::vector<std::vector<std::array<int, 10>>> all_edge_candidates(n_edges,
                                                                              std::vector<std::array<int, 10>>());
            std::vector<std::vector<int>> all_edge_candidates_selected_edges_ind(n_edges, std::vector<int>());

            selected_edges_ind[0] = min_edge_ind;
            selected_edges[min_edge_ind] = true;  // set the first edge as occupied
            selected_edges[(min_edge_ind + n_edges) %
                           (2 * n_edges)] = true;  // the reversed direction of the edge will be also occupied

            int current_index = 1;

            std::vector<int> src_vertices;
            std::vector<int> dst_vertices;

            // how many edges in built_min_code use the vertices?
            std::map<int, int> amount_of_usage_of_original_vertices;

            // here we keep the mapping of min_code ids to edge_list vertex ids:
            std::map<int, int> vertex_id_mapping;
            vertex_id_mapping[0] = edge_list[min_edge_ind][0];
            vertex_id_mapping[1] = edge_list[min_edge_ind][1];

            for (int i = 0; i < edge_list.size(); i++)
            {
                src_vertices.push_back(edge_list[i][0]);
                dst_vertices.push_back(edge_list[i][1]);
                // all nodes are used 0-times at first
                amount_of_usage_of_original_vertices[edge_list[i][0]] = 0;
                amount_of_usage_of_original_vertices[edge_list[i][1]] = 0;
            }

            // we occupied the first two nodes:
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][0]] = 1;
            amount_of_usage_of_original_vertices[edge_list[min_edge_ind][1]] = 1;

            // do DFS
            while (true)
            {
                if (current_index >= n_edges)
                {
                    current_index--;
                }
                if (current_index == 0)
                {
                    // (we have tried all posibilities from the current initial edge)
                    // we backtracked back to 0, we should start finding the minimum code from other position (break the repeat loop)
                    // (we couldn't find it here)
                    break;
                }

                // we just moved by one edge, find all candidates for growing the the pattern:
                if (selected_candidates[current_index] == 0)
                {
                    std::deque<int> right_most_path = find_rightmost_path(built_min_code);
                    std::deque<int> right_most_path_occurrence;
                    for (int i = 0; i < right_most_path.size(); i++)
                    {
                        right_most_path_occurrence.push_back(vertex_id_mapping[right_most_path[i]]);
                    }
                    int right_most_vertex = right_most_path_occurrence.back();

                    std::vector<labeled_pattern_edge> edge_candidates;

                    // find backward edge candidates:
                    int src = right_most_vertex;
                    for (int i = 0; i < right_most_path.size() - 1; i++)
                    {
                        int dst = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src && dst_vertices[j] == dst)
                            {
                                std::array<int, 10> e_cand = {right_most_path.back(), right_most_path[i],
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};
                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    // find forward edge candidates:
                    for (int i = right_most_path.size() - 1; i >= 0; i--)
                    {
                        src = right_most_path_occurrence[i];
                        for (int j = 0; j < selected_edges.size(); j++)
                        {
                            if (!selected_edges[j] && src_vertices[j] == src &&
                                amount_of_usage_of_original_vertices[dst_vertices[j]] == 0)
                            {
                                std::array<int, 10> e_cand = {right_most_path[i], right_most_path.back() + 1,
                                                              edge_list[j][2], edge_list[j][3], edge_list[j][4],
                                                              edge_list[j][5], edge_list[j][6], edge_list[j][7],
                                                              edge_list[j][8], edge_list[j][9]};
                                labeled_pattern_edge e_candidate;
                                e_candidate.elements = e_cand;
                                e_candidate.index = j;
                                edge_candidates.push_back(e_candidate);
                            }
                        }
                    }

                    std::sort(edge_candidates.begin(), edge_candidates.end(), cmp_labeled_pattern_edge);

                    all_edge_candidates[current_index].clear();
                    all_edge_candidates_selected_edges_ind[current_index].clear();
                    for (size_t i = 0; i < edge_candidates.size(); i++)
                    {
                        if (i > 0 &&
                            is_pattern_edge_smaller_than(edge_candidates[i - 1].elements, edge_candidates[i].elements,
                                                         true))
                        {
                            // don't take candidates that cannot have smaller code
                            break;
                        }
                        all_edge_candidates[current_index].push_back(edge_candidates[i].elements);
                        all_edge_candidates_selected_edges_ind[current_index].push_back(edge_candidates[i].index);
                    }
                }

                // try to use the candidates
                bool should_backtrack = true;
                for (int edge_candidate_ind = selected_candidates[current_index];
                     edge_candidate_ind < all_edge_candidates[current_index].size(); edge_candidate_ind++)
                {
                    bool is_smaller = is_pattern_edge_smaller_than(
                            all_edge_candidates[current_index][edge_candidate_ind], edge_list[current_index], true);

                    if (is_smaller)
                    {
                        return false;
                    }
                    if (is_pattern_edge_equal_to(all_edge_candidates[current_index][edge_candidate_ind],
                                                 edge_list[current_index], true))
                    {
                        // they are same, so append it and move to other edge
                        // NOTE: there can be several edges with the same code (if necessary, these must be tested later as well)
                        selected_candidates[current_index] = edge_candidate_ind + 1;
                        built_min_code.push_back(all_edge_candidates[current_index][edge_candidate_ind]);

                        vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][0]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0];
                        vertex_id_mapping[all_edge_candidates[current_index][edge_candidate_ind][1]] = edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1];

                        amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][0]] += 1;
                        amount_of_usage_of_original_vertices[edge_list[all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind]][1]] += 1;

                        int sel_e_ind = all_edge_candidates_selected_edges_ind[current_index][edge_candidate_ind];
                        selected_edges_ind[current_index] = sel_e_ind;
                        selected_edges[sel_e_ind] = true;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = true;

                        current_index++;
                        should_backtrack = false;
                        break;
                    }
                }

                // the candidate edge made larger code or we don't have more candidates to try:
                if (should_backtrack)
                {
                    selected_candidates[current_index] = 0;

                    // now we need to decrement the usage of these two vertices:
                    int decremented1 = vertex_id_mapping[built_min_code.back()[0]];
                    int decremented2 = vertex_id_mapping[built_min_code.back()[1]];
                    amount_of_usage_of_original_vertices[decremented1] -= 1;
                    amount_of_usage_of_original_vertices[decremented2] -= 1;

                    built_min_code.pop_back();

                    int sel_e_ind = selected_edges_ind[current_index];
                    if (sel_e_ind != -1)
                    {
                        selected_edges[sel_e_ind] = false;
                        selected_edges[(sel_e_ind + n_edges) % (2 * n_edges)] = false;
                        selected_edges_ind[current_index] = -1;
                    }

                    current_index--;
                }
            }

        }

        // we could not find a smaller code
        return true;
    }